

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O1

int SetMotorOriginIM483I(IM483I *pIM483I)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int writebuflen;
  char *__s;
  char recvbuf [512];
  timespec local_438 [32];
  uint8 local_238 [520];
  
  memset(local_238 + 3,0,0x1fd);
  local_238[0] = 'O';
  local_238[1] = '\r';
  local_238[2] = 0;
  sVar2 = strlen((char *)local_238);
  writebuflen = (int)sVar2;
  iVar1 = WriteDataIM483I(pIM483I,local_238,writebuflen,pIM483I->bytedelayus);
  iVar4 = 1;
  if (iVar1 == 0) {
    if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_238,(long)writebuflen,1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    local_438[0].tv_sec = 0;
    local_438[0].tv_nsec = 100000000;
    nanosleep(local_438,(timespec *)0x0);
    if (pIM483I->bCheckState == 0) {
      return 0;
    }
    memset(local_438,0,0x200);
    uVar5 = writebuflen + 1;
    iVar1 = (pIM483I->RS232Port).DevType;
    __s = "Error reading data from a IM483I. ";
    if (iVar1 - 1U < 4) {
      if (-1 < writebuflen) {
        iVar1 = (pIM483I->RS232Port).s;
        uVar7 = 0;
        do {
          sVar3 = recv(iVar1,(void *)((long)&local_438[0].tv_sec + uVar7),
                       (long)(int)(uVar5 - (int)uVar7),0);
          if ((int)sVar3 < 1) goto LAB_0011ac8d;
          uVar6 = (int)uVar7 + (int)sVar3;
          uVar7 = (ulong)uVar6;
        } while ((int)uVar6 <= writebuflen);
      }
    }
    else {
      if (iVar1 != 0) goto LAB_0011ab15;
      if (uVar5 != 0) {
        iVar1 = *(int *)&(pIM483I->RS232Port).hDev;
        uVar7 = 0;
        do {
          sVar3 = read(iVar1,(void *)((long)&local_438[0].tv_sec + uVar7),
                       (ulong)(uVar5 - (int)uVar7));
          if ((int)sVar3 < 1) goto LAB_0011ac8d;
          uVar6 = (int)uVar7 + (int)sVar3;
          uVar7 = (ulong)uVar6;
        } while (uVar6 < uVar5);
      }
    }
    if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_438,(long)(int)uVar5,1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    iVar1 = strncmp((char *)local_438,(char *)local_238,(long)writebuflen);
    iVar4 = 4;
    __s = "Error reading data from a IM483I : Invalid data. ";
    if ((iVar1 == 0) && (*(char *)((long)&local_438[0].tv_sec + (long)writebuflen) == '\n')) {
      return 0;
    }
  }
  else {
    __s = "Error writing data to a IM483I. ";
  }
  goto LAB_0011ab15;
LAB_0011ac8d:
  iVar4 = 1;
LAB_0011ab15:
  puts(__s);
  return iVar4;
}

Assistant:

inline int SetMotorOriginIM483I(IM483I* pIM483I)
{
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "O\r");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a IM483I. \n");
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	// Seem to take time...
	mSleep(100);

	if (pIM483I->bCheckState)
	{
		// Should echo and add \n...

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sendbuflen+1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a IM483I. \n");
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if ((strncmp(recvbuf, sendbuf, sendbuflen) != 0)||(recvbuf[recvbuflen-1] != '\n'))
		{
			printf("Error reading data from a IM483I : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
	}

	return EXIT_SUCCESS;
}